

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O1

Vec_Int_t *
Gia_PolynCoreOrder_int
          (Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Wec_t *vMap,Vec_Int_t *vRoots,Vec_Int_t **pvIns)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  Vec_Int_t *p;
  int *piVar6;
  void *__s;
  Vec_Int_t *pVVar7;
  sbyte sVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p->pArray = piVar6;
  iVar9 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
  if (iVar9 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar9 * 4);
  }
  uVar17 = iVar9 * 0x20;
  memset(__s,0,(long)iVar9 << 2);
  iVar2 = vRoots->nSize;
  if (0 < (long)iVar2) {
    piVar6 = vRoots->pArray;
    lVar15 = 0;
    do {
      uVar14 = piVar6[lVar15];
      if (((int)uVar14 < 0) || ((int)uVar17 <= (int)uVar14)) {
LAB_006633c7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)((long)__s + (ulong)(uVar14 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar14 & 0x1f);
      lVar15 = lVar15 + 1;
    } while (iVar2 != lVar15);
  }
  iVar2 = -1;
  uVar14 = 0xffffffff;
  do {
    if (vRoots->nSize < 1) {
      lVar15 = 0;
    }
    else {
      lVar15 = 0;
      do {
        uVar13 = vRoots->pArray[lVar15];
        if (((int)uVar13 < 0) || (vMap->nSize <= (int)uVar13)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        iVar3 = vMap->pArray[uVar13].nSize;
        iVar18 = 0;
        if (1 < iVar3) {
          piVar6 = vMap->pArray[uVar13].pArray;
          lVar12 = 1;
          do {
            lVar19 = lVar12;
            uVar14 = piVar6[lVar19];
            if (((int)uVar14 < 0) || ((int)uVar17 <= (int)uVar14)) goto LAB_0066336a;
            lVar12 = lVar19;
          } while (((*(uint *)((long)__s + (ulong)(uVar14 >> 5) * 4) >> (uVar14 & 0x1f) & 1) == 0)
                  && (lVar12 = lVar19 + 2, (int)lVar12 < iVar3));
          iVar18 = (int)lVar12 + -1;
          iVar2 = piVar6[(int)lVar19 - 1U & 0xfffffffe];
        }
        if (iVar18 != iVar3) {
          if ((int)uVar17 <= (int)uVar13) {
LAB_0066336a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if ((*(uint *)((long)__s + (ulong)(uVar13 >> 5) * 4) >> (uVar13 & 0x1f) & 1) == 0) {
            __assert_fail("Vec_BitEntry(vIsRoot, Entry1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                          ,0x80,
                          "Vec_Int_t *Gia_PolynCoreOrder_int(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t **)"
                         );
          }
          if (((int)uVar14 < 0) || ((int)uVar17 <= (int)uVar14)) goto LAB_0066336a;
          if ((*(uint *)((long)__s + (ulong)(uVar14 >> 5) * 4) >> (uVar14 & 0x1f) & 1) == 0) {
            __assert_fail("Vec_BitEntry(vIsRoot, Entry2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                          ,0x81,
                          "Vec_Int_t *Gia_PolynCoreOrder_int(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t **)"
                         );
          }
          Vec_IntPush(p,iVar2);
          sVar8 = (sbyte)(uVar13 & 0x1f);
          puVar1 = (uint *)((long)__s + (ulong)(uVar13 >> 5) * 4);
          *puVar1 = *puVar1 & (-2 << sVar8 | 0xfffffffeU >> 0x20 - sVar8);
          sVar8 = (sbyte)(uVar14 & 0x1f);
          puVar1 = (uint *)((long)__s + (ulong)(uVar14 >> 5) * 4);
          *puVar1 = *puVar1 & (-2 << sVar8 | 0xfffffffeU >> 0x20 - sVar8);
          uVar5 = vRoots->nSize;
          uVar11 = 0;
          bVar20 = 0 < (int)uVar5;
          if (0 < (int)uVar5) {
            bVar20 = true;
            if (*vRoots->pArray != uVar13) {
              uVar16 = 0;
              do {
                if ((ulong)uVar5 - 1 == uVar16) {
                  bVar20 = false;
                  uVar11 = (ulong)uVar5;
                  goto LAB_00663092;
                }
                uVar11 = uVar16 + 1;
                lVar12 = uVar16 + 1;
                uVar16 = uVar11;
              } while (vRoots->pArray[lVar12] != uVar13);
              bVar20 = uVar11 < uVar5;
            }
          }
LAB_00663092:
          if ((uint)uVar11 != uVar5) {
            if (!bVar20) goto LAB_00663405;
            uVar13 = (uint)uVar11 + 1;
            if ((int)uVar13 < (int)uVar5) {
              piVar4 = vRoots->pArray;
              piVar6 = piVar4 + uVar13;
              do {
                iVar10 = (int)uVar11;
                piVar4[uVar11 & 0xffffffff] = *piVar6;
                uVar5 = vRoots->nSize;
                uVar11 = (ulong)(iVar10 + 1);
                piVar6 = piVar6 + 1;
              } while (iVar10 + 2 < (int)uVar5);
            }
            vRoots->nSize = uVar5 - 1;
          }
          uVar13 = vRoots->nSize;
          uVar11 = 0;
          bVar20 = 0 < (int)uVar13;
          if (0 < (int)uVar13) {
            bVar20 = true;
            if (*vRoots->pArray != uVar14) {
              uVar16 = 0;
              do {
                if ((ulong)uVar13 - 1 == uVar16) {
                  bVar20 = false;
                  uVar11 = (ulong)uVar13;
                  goto LAB_00663110;
                }
                uVar11 = uVar16 + 1;
                lVar12 = uVar16 + 1;
                uVar16 = uVar11;
              } while (vRoots->pArray[lVar12] != uVar14);
              bVar20 = uVar11 < uVar13;
            }
          }
LAB_00663110:
          if ((uint)uVar11 != uVar13) {
            if (!bVar20) {
LAB_00663405:
              __assert_fail("i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
            }
            uVar14 = (uint)uVar11 + 1;
            if ((int)uVar14 < (int)uVar13) {
              piVar4 = vRoots->pArray;
              piVar6 = piVar4 + uVar14;
              do {
                iVar10 = (int)uVar11;
                piVar4[uVar11 & 0xffffffff] = *piVar6;
                uVar13 = vRoots->nSize;
                piVar6 = piVar6 + 1;
                uVar11 = (ulong)(iVar10 + 1);
              } while (iVar10 + 2 < (int)uVar13);
            }
            vRoots->nSize = uVar13 - 1;
          }
          if (iVar2 < 0) {
LAB_006633a8:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar13 = iVar2 * 6;
          uVar14 = vAdds->nSize;
          if (((uVar14 == uVar13 || SBORROW4(uVar14,uVar13) != (int)(uVar14 + iVar2 * -6) < 0) ||
              ((int)uVar14 <= (int)(uVar13 | 1))) || ((int)uVar14 <= (int)(uVar13 + 2)))
          goto LAB_006633a8;
          piVar6 = vAdds->pArray;
          uVar5 = piVar6[uVar13];
          if (((int)uVar5 < 0) || ((int)uVar17 <= (int)uVar5)) goto LAB_006633c7;
          uVar14 = piVar6[uVar13 | 1];
          uVar13 = piVar6[uVar13 + 2];
          puVar1 = (uint *)((long)__s + (ulong)(uVar5 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
          if ((((int)uVar14 < 0) ||
              (((int)uVar17 <= (int)uVar14 ||
               (puVar1 = (uint *)((long)__s + (ulong)(uVar14 >> 5) * 4),
               *puVar1 = *puVar1 | 1 << ((byte)uVar14 & 0x1f), (int)uVar13 < 0)))) ||
             ((int)uVar17 <= (int)uVar13)) goto LAB_006633c7;
          puVar1 = (uint *)((long)__s + (ulong)(uVar13 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar13 & 0x1f);
          if (0 < (long)vRoots->nSize) {
            lVar12 = 0;
            do {
              if (vRoots->pArray[lVar12] == uVar5) goto LAB_00663238;
              lVar12 = lVar12 + 1;
            } while (vRoots->nSize != lVar12);
          }
          Vec_IntPush(vRoots,uVar5);
LAB_00663238:
          if (0 < (long)vRoots->nSize) {
            lVar12 = 0;
            do {
              if (vRoots->pArray[lVar12] == uVar14) goto LAB_00663268;
              lVar12 = lVar12 + 1;
            } while (vRoots->nSize != lVar12);
          }
          Vec_IntPush(vRoots,uVar14);
LAB_00663268:
          if (0 < (long)vRoots->nSize) {
            lVar12 = 0;
            do {
              if (vRoots->pArray[lVar12] == uVar13) goto LAB_00663299;
              lVar12 = lVar12 + 1;
            } while (vRoots->nSize != lVar12);
          }
          Vec_IntPush(vRoots,uVar13);
        }
LAB_00663299:
      } while ((iVar18 == iVar3) && (lVar15 = lVar15 + 1, lVar15 < vRoots->nSize));
    }
    if ((int)lVar15 == vRoots->nSize) {
      if (pvIns != (Vec_Int_t **)0x0) {
        pVVar7 = (Vec_Int_t *)malloc(0x10);
        pVVar7->nSize = 0;
        pVVar7->nCap = uVar17;
        if (iVar9 == 0) {
          piVar6 = (int *)0x0;
        }
        else {
          piVar6 = (int *)malloc((long)(int)uVar17 << 2);
        }
        pVVar7->pArray = piVar6;
        *pvIns = pVVar7;
        if (0 < iVar9) {
          uVar14 = 2;
          if (2 < (int)uVar17) {
            uVar14 = uVar17;
          }
          uVar17 = 1;
          do {
            if ((*(uint *)((long)__s + (ulong)(uVar17 >> 5) * 4) >> (uVar17 & 0x1f) & 1) != 0) {
              Vec_IntPush(*pvIns,uVar17);
            }
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      return p;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Gia_PolynCoreOrder_int( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Wec_t * vMap, Vec_Int_t * vRoots, Vec_Int_t ** pvIns )
{
    Vec_Int_t * vOrder  = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, k, Index = -1, Driver, Entry1, Entry2 = -1;
    // mark roots
    Vec_IntForEachEntry( vRoots, Driver, i )
        Vec_BitWriteEntry( vIsRoot, Driver, 1 );
    // collect boxes
    while ( 1 )
    {
        // iterate through boxes driving this one
        Vec_IntForEachEntry( vRoots, Entry1, i )
        {
            Vec_Int_t * vLevel = Vec_WecEntry( vMap, Entry1 );
            Vec_IntForEachEntryDouble( vLevel, Index, Entry2, k )
                if ( Vec_BitEntry(vIsRoot, Entry2) )
                    break;
            if ( k == Vec_IntSize(vLevel) )
                continue;
            assert( Vec_BitEntry(vIsRoot, Entry1) );
            assert( Vec_BitEntry(vIsRoot, Entry2) );
            // collect adder
            Vec_IntPush( vOrder, Index );
            // clean marks
            Vec_BitWriteEntry( vIsRoot, Entry1, 0 );
            Vec_BitWriteEntry( vIsRoot, Entry2, 0 );
            Vec_IntRemove( vRoots, Entry1 );
            Vec_IntRemove( vRoots, Entry2 );
            // set new marks
            Entry1 = Vec_IntEntry( vAdds, 6*Index + 0 );
            Entry2 = Vec_IntEntry( vAdds, 6*Index + 1 );
            Driver = Vec_IntEntry( vAdds, 6*Index + 2 );
            Vec_BitWriteEntry( vIsRoot, Entry1, 1 );
            Vec_BitWriteEntry( vIsRoot, Entry2, 1 );
            Vec_BitWriteEntry( vIsRoot, Driver, 1 );
            Vec_IntPushUnique( vRoots, Entry1 );
            Vec_IntPushUnique( vRoots, Entry2 );
            Vec_IntPushUnique( vRoots, Driver );
            break;
        }
        if ( i == Vec_IntSize(vRoots) )
            break;
    }
    // collect remaining leaves
    if ( pvIns )
    {
        *pvIns = Vec_IntAlloc( Vec_BitSize(vIsRoot) );
        Vec_BitForEachEntryStart( vIsRoot, Driver, i, 1 )
            if ( Driver )
                Vec_IntPush( *pvIns, i );
    }
    Vec_BitFree( vIsRoot );
    return vOrder;
}